

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5ParseSetColset(Fts5Parse *pParse,Fts5ExprNode *pNode,Fts5Colset *pColset,
                       Fts5Colset **ppFree)

{
  long lVar1;
  Fts5Colset *pFVar2;
  Fts5Colset *in_RCX;
  Fts5ExprNode *in_RDX;
  Fts5Parse *in_RSI;
  long in_RDI;
  int i;
  Fts5ExprNearset *pNear;
  int local_2c;
  Fts5Colset **in_stack_ffffffffffffffd8;
  Fts5ExprNode *pOrig;
  
  if (*(int *)(in_RDI + 0x10) == 0) {
    if ((*(int *)&in_RSI->pConfig == 9) || (*(int *)&in_RSI->pConfig == 4)) {
      pOrig = in_RSI->pExpr;
      lVar1._0_4_ = pOrig->bNomatch;
      lVar1._4_4_ = pOrig->iHeight;
      if (lVar1 == 0) {
        if (*in_RCX == (Fts5Colset)0x0) {
          pFVar2 = fts5CloneColset(&in_RCX->nCol,(Fts5Colset *)pOrig);
          *(Fts5Colset **)&pOrig->bNomatch = pFVar2;
        }
        else {
          *(Fts5ExprNode **)&pOrig->bNomatch = in_RDX;
          in_RCX->nCol = 0;
          in_RCX->aiCol[0] = 0;
        }
      }
      else {
        fts5MergeColset(*(Fts5Colset **)&pOrig->bNomatch,(Fts5Colset *)in_RDX);
        if (**(int **)&pOrig->bNomatch == 0) {
          *(undefined4 *)&in_RSI->pConfig = 0;
          in_RSI->rc = 0;
          in_RSI->nPhrase = 0;
        }
      }
    }
    else {
      for (local_2c = 0; local_2c < in_RSI->bPhraseToAnd; local_2c = local_2c + 1) {
        fts5ParseSetColset(in_RSI,in_RDX,in_RCX,in_stack_ffffffffffffffd8);
      }
    }
  }
  return;
}

Assistant:

static void fts5ParseSetColset(
  Fts5Parse *pParse,
  Fts5ExprNode *pNode,
  Fts5Colset *pColset,
  Fts5Colset **ppFree
){
  if( pParse->rc==SQLITE_OK ){
    assert( pNode->eType==FTS5_TERM || pNode->eType==FTS5_STRING
         || pNode->eType==FTS5_AND  || pNode->eType==FTS5_OR
         || pNode->eType==FTS5_NOT  || pNode->eType==FTS5_EOF
    );
    if( pNode->eType==FTS5_STRING || pNode->eType==FTS5_TERM ){
      Fts5ExprNearset *pNear = pNode->pNear;
      if( pNear->pColset ){
        fts5MergeColset(pNear->pColset, pColset);
        if( pNear->pColset->nCol==0 ){
          pNode->eType = FTS5_EOF;
          pNode->xNext = 0;
        }
      }else if( *ppFree ){
        pNear->pColset = pColset;
        *ppFree = 0;
      }else{
        pNear->pColset = fts5CloneColset(&pParse->rc, pColset);
      }
    }else{
      int i;
      assert( pNode->eType!=FTS5_EOF || pNode->nChild==0 );
      for(i=0; i<pNode->nChild; i++){
        fts5ParseSetColset(pParse, pNode->apChild[i], pColset, ppFree);
      }
    }
  }
}